

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SequenceRepetition::SequenceRepetition
          (SequenceRepetition *this,SequenceRepetitionSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  SequenceRange SVar2;
  undefined4 local_38;
  ASTContext *context_local;
  SequenceRepetitionSyntax *syntax_local;
  SequenceRepetition *this_local;
  
  this->kind = Consecutive;
  SequenceRange::SequenceRange(&this->range);
  TVar1 = (syntax->op).kind;
  if (TVar1 == Plus) {
    this->kind = Consecutive;
    (this->range).min = 1;
  }
  else {
    if (TVar1 == MinusArrow) {
      this->kind = GoTo;
    }
    else if (TVar1 == Equals) {
      this->kind = Nonconsecutive;
    }
    else {
      this->kind = Consecutive;
    }
    if (syntax->selector != (SelectorSyntax *)0x0) {
      SVar2 = SequenceRange::fromSyntax(syntax->selector,context,true);
      local_38 = CONCAT31(local_38._1_3_,
                          SVar2.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int>._M_engaged);
      (this->range).min = (int)SVar2._0_8_;
      (this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload =
           (_Storage<unsigned_int,_true>)(int)((ulong)SVar2._0_8_ >> 0x20);
      *(undefined4 *)
       &(this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = local_38;
    }
  }
  return;
}

Assistant:

SequenceRepetition::SequenceRepetition(const SequenceRepetitionSyntax& syntax,
                                       const ASTContext& context) {
    switch (syntax.op.kind) {
        case TokenKind::Equals:
            kind = Nonconsecutive;
            break;
        case TokenKind::MinusArrow:
            kind = GoTo;
            break;
        case TokenKind::Plus:
            // No expressions allowed for plus.
            kind = Consecutive;
            range.min = 1;
            return;
        default:
            kind = Consecutive;
            break;
    }

    if (syntax.selector)
        range = SequenceRange::fromSyntax(*syntax.selector, context, /* allowUnbounded */ true);
}